

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:242:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:242:7)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  bool bVar1;
  __pid_t _Var2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char buf [4];
  uint local_4c;
  Array<char> local_48;
  unsigned_long local_30;
  
  (**(params_1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_48,&params_1->super_AsyncOutputStream,"foo",3);
  Promise<void>::wait((Promise<void> *)&local_48,params_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_48);
  (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_48,params_1,buf,3,4);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_48,params_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_48);
  if ((CONCAT44(extraout_var,_Var2) != 3) && (_::Debug::minSeverity < 3)) {
    local_4c = 3;
    (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_48,params_1,buf,3,4);
    _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_48,params_2);
    local_30 = CONCAT44(extraout_var_00,_Var2);
    _::Debug::log<char_const(&)[69],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf5,ERROR,
               "\"failed: expected \" \"(3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))\", 3u, stream.tryRead(buf, 3, 4).wait(waitScope)"
               ,(char (*) [69])
                "failed: expected (3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))",&local_4c,
               &local_30);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_48);
  }
  heapString((String *)&local_48,buf,3);
  bVar1 = operator==("bar",(String *)&local_48);
  Array<char>::~Array(&local_48);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    heapString((String *)&local_48,buf,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (heapString(buf, 3))\", \"bar\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"bar\") == (heapString(buf, 3))",
               (char (*) [4])0x33b5a1,(String *)&local_48);
    Array<char>::~Array(&local_48);
  }
  (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_48,params_1,buf,1,1);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_48,params_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_48);
  if ((CONCAT44(extraout_var_01,_Var2) != 0) && (_::Debug::minSeverity < 3)) {
    local_4c = 0;
    (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_48,params_1,buf,1,1);
    _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_48,params_2);
    local_30 = CONCAT44(extraout_var_02,_Var2);
    _::Debug::log<char_const(&)[68],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf9,ERROR,
               "\"failed: expected \" \"(0) == (stream.tryRead(buf, 1, 1).wait(waitScope))\", 0, stream.tryRead(buf, 1, 1).wait(waitScope)"
               ,(char (*) [68])"failed: expected (0) == (stream.tryRead(buf, 1, 1).wait(waitScope))"
               ,(int *)&local_4c,&local_30);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_48);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }